

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwizard.cpp
# Opt level: O0

void __thiscall QWizard::removePage(QWizard *this,int id)

{
  long lVar1;
  bool bVar2;
  QWizardPrivate *this_00;
  size_type_conflict sVar3;
  int *piVar4;
  QLayout *this_01;
  QWizardPagePrivate *pQVar5;
  qsizetype qVar6;
  const_reference pQVar7;
  int in_ESI;
  long *in_RDI;
  long in_FS_OFFSET;
  int i;
  int firstId;
  QWizardPage *removedPage;
  QWizardPrivate *d;
  QWizardPrivate *in_stack_000000a8;
  undefined4 in_stack_ffffffffffffffa8;
  int in_stack_ffffffffffffffac;
  QWizardPrivate *in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffc0;
  int iVar8;
  int in_stack_ffffffffffffffc4;
  QWizardPrivate *this_02;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = d_func((QWizard *)0x7ba9ae);
  this_02 = (QWizardPrivate *)0x0;
  sVar3 = QMap<int,_QWizardPage_*>::size((QMap<int,_QWizardPage_*> *)in_stack_ffffffffffffffb0);
  if ((0 < sVar3) && (this_00->start == in_ESI)) {
    QMap<int,_QWizardPage_*>::constBegin
              ((QMap<int,_QWizardPage_*> *)
               CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
    piVar4 = QMap<int,_QWizardPage_*>::const_iterator::key((const_iterator *)0x7baa0c);
    in_stack_ffffffffffffffc4 = *piVar4;
    if (in_stack_ffffffffffffffc4 == in_ESI) {
      sVar3 = QMap<int,_QWizardPage_*>::size((QMap<int,_QWizardPage_*> *)in_stack_ffffffffffffffb0);
      if (sVar3 < 2) {
        this_00->start = -1;
      }
      else {
        QMap<int,_QWizardPage_*>::constBegin
                  ((QMap<int,_QWizardPage_*> *)
                   CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
        QMap<int,_QWizardPage_*>::const_iterator::operator++
                  ((const_iterator *)in_stack_ffffffffffffffb0);
        piVar4 = QMap<int,_QWizardPage_*>::const_iterator::key((const_iterator *)0x7baa5b);
        this_00->start = *piVar4;
      }
    }
    else {
      this_00->start = in_stack_ffffffffffffffc4;
    }
    this_00->startSetByUser = false;
  }
  bVar2 = QMap<int,_QWizardPage_*>::contains
                    ((QMap<int,_QWizardPage_*> *)
                     CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),(int *)in_RDI);
  if (bVar2) {
    pageRemoved((QWizard *)0x7baac2,in_stack_ffffffffffffffac);
  }
  bVar2 = QListSpecialMethodsBase<int>::contains<int>
                    ((QListSpecialMethodsBase<int> *)in_stack_ffffffffffffffb0,
                     (int *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
  if (bVar2) {
    if (in_ESI == this_00->current) {
      qVar6 = QList<int>::size(&this_00->history);
      if (qVar6 == 1) {
        QWizardPrivate::reset(this_02);
        this_01 = (QLayout *)
                  QMap<int,_QWizardPage_*>::take
                            ((QMap<int,_QWizardPage_*> *)
                             CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                             (int *)in_RDI);
        bVar2 = QMap<int,_QWizardPage_*>::isEmpty
                          ((QMap<int,_QWizardPage_*> *)in_stack_ffffffffffffffb0);
        if (bVar2) {
          QWizardPrivate::updateCurrentPage(in_stack_ffffffffffffffb0);
        }
        else {
          restart((QWizard *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
        }
      }
      else {
        back((QWizard *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
        this_01 = (QLayout *)
                  QMap<int,_QWizardPage_*>::take
                            ((QMap<int,_QWizardPage_*> *)
                             CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                             (int *)in_RDI);
        QWizardPrivate::updateCurrentPage(in_stack_ffffffffffffffb0);
      }
    }
    else {
      this_01 = (QLayout *)
                QMap<int,_QWizardPage_*>::take
                          ((QMap<int,_QWizardPage_*> *)
                           CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                           (int *)in_RDI);
      QList<int>::removeOne<int>
                ((QList<int> *)in_stack_ffffffffffffffb0,
                 (int *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
      QWizardPrivate::_q_updateButtonStates(in_stack_000000a8);
    }
  }
  else {
    this_01 = (QLayout *)
              QMap<int,_QWizardPage_*>::take
                        ((QMap<int,_QWizardPage_*> *)
                         CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),(int *)in_RDI
                        );
    QWizardPrivate::updateCurrentPage(in_stack_ffffffffffffffb0);
  }
  if (this_01 != (QLayout *)0x0) {
    pQVar5 = QWizardPage::d_func((QWizardPage *)0x7bac0b);
    if ((pQVar5->initialized & 1U) != 0) {
      (**(code **)(*in_RDI + 0x1e0))(in_RDI,in_ESI);
      pQVar5 = QWizardPage::d_func((QWizardPage *)0x7bac30);
      pQVar5->initialized = false;
    }
    QLayout::removeWidget
              (this_01,(QWidget *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
    qVar6 = QList<QWizardField>::size(&this_00->fields);
    iVar8 = (int)qVar6;
    while (iVar8 = iVar8 + -1, -1 < iVar8) {
      pQVar7 = QList<QWizardField>::at
                         ((QList<QWizardField> *)in_stack_ffffffffffffffb0,
                          CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
      if ((QLayout *)pQVar7->page == this_01) {
        in_stack_ffffffffffffffb0 =
             (QWizardPrivate *)
             QList<QWizardField>::at
                       ((QList<QWizardField> *)in_stack_ffffffffffffffb0,
                        CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
        QWizardPage::d_func((QWizardPage *)0x7bacb2);
        QList<QWizardField>::operator+=
                  ((QList<QWizardField> *)in_stack_ffffffffffffffb0,
                   (parameter_type)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
        QWizardPrivate::removeFieldAt(this_00,(int)((ulong)this_01 >> 0x20));
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QWizard::removePage(int id)
{
    Q_D(QWizard);

    QWizardPage *removedPage = nullptr;

    // update startItem accordingly
    if (d->pageMap.size() > 0) { // only if we have any pages
        if (d->start == id) {
            const int firstId = d->pageMap.constBegin().key();
            if (firstId == id) {
                if (d->pageMap.size() > 1)
                    d->start = (++d->pageMap.constBegin()).key(); // secondId
                else
                    d->start = -1; // removing the last page
            } else { // startSetByUser has to be "true" here
                d->start = firstId;
            }
            d->startSetByUser = false;
        }
    }

    if (d->pageMap.contains(id))
        emit pageRemoved(id);

    if (!d->history.contains(id)) {
        // Case 1: removing a page not in the history
        removedPage = d->pageMap.take(id);
        d->updateCurrentPage();
    } else if (id != d->current) {
        // Case 2: removing a page in the history before the current page
        removedPage = d->pageMap.take(id);
        d->history.removeOne(id);
        d->_q_updateButtonStates();
    } else if (d->history.size() == 1) {
        // Case 3: removing the current page which is the first (and only) one in the history
        d->reset();
        removedPage = d->pageMap.take(id);
        if (d->pageMap.isEmpty())
            d->updateCurrentPage();
        else
            restart();
    } else {
        // Case 4: removing the current page which is not the first one in the history
        back();
        removedPage = d->pageMap.take(id);
        d->updateCurrentPage();
    }

    if (removedPage) {
        if (removedPage->d_func()->initialized) {
            cleanupPage(id);
            removedPage->d_func()->initialized = false;
        }

        d->pageVBoxLayout->removeWidget(removedPage);

        for (int i = d->fields.size() - 1; i >= 0; --i) {
            if (d->fields.at(i).page == removedPage) {
                removedPage->d_func()->pendingFields += d->fields.at(i);
                d->removeFieldAt(i);
            }
        }
    }
}